

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber.cpp
# Opt level: O1

int __thiscall cilk_fiber::remove_reference(cilk_fiber *this,cilk_fiber_pool *pool)

{
  cilk_fiber_sysdep *self;
  
  if (pool == (cilk_fiber_pool *)0x0) {
    cilk_fiber_sysdep::~cilk_fiber_sysdep((cilk_fiber_sysdep *)this);
    __cilkrts_free(this);
  }
  else {
    deallocate_self(this,pool);
  }
  return 0;
}

Assistant:

int cilk_fiber::remove_reference(cilk_fiber_pool* pool)
{
    int ref_count = this->dec_ref_count();
    if (ref_count == 0) {
        if (pool) {
            deallocate_self(pool);
        }
        else {
            deallocate_to_heap();
        }
    }
    return ref_count;
}